

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  Array<asmjit::v1_14::OperandSignature,_32UL> *pAVar1;
  byte *pbVar2;
  Arch AVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint32_t uVar7;
  Signature SVar8;
  uint uVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  Error EVar13;
  uint regId;
  OperandSignature *pOVar14;
  WorkData *pWVar15;
  InstHints *pIVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 uVar23;
  ulong uVar24;
  uint32_t uVar25;
  uint uVar26;
  RegGroup local_5f9;
  BaseReg dstReg;
  uint32_t local_5d0;
  uint local_5cc;
  long local_5c8;
  WorkData *local_5c0;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_5b8;
  Array<asmjit::v1_14::InstHints,_4UL> *local_5b0;
  RegGroup outGroup;
  undefined3 uStack_5a7;
  uint local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  FuncFrame *local_598;
  ulong local_590;
  BaseEmitHelper *local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  AVar3 = frame->_arch;
  constraints._availableRegs._data[0] = 0;
  constraints._availableRegs._data[1] = 0;
  constraints._availableRegs._data[2] = 0;
  constraints._availableRegs._data[3] = 0;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar13 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)AVar3);
  if ((EVar13 != 0) ||
     (EVar13 = FuncArgsContext::initWorkData(&ctx,frame,args,&constraints), EVar13 != 0)) {
    return EVar13;
  }
  lVar20 = (ulong)AVar3 * 0xd8;
  local_5b0 = (Array<asmjit::v1_14::InstHints,_4UL> *)(_archTraits + lVar20);
  uVar22 = (ulong)ctx._varCount;
  local_578 = (ulong)ctx._saVarId;
  regId = (uint)*(byte *)local_5b0;
  local_5b8 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)
              CONCAT44(local_5b8._4_4_,(uint)*(byte *)local_5b0);
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
      if (ctx._saVarId < ctx._varCount) {
        regId = (uint)*(byte *)((long)&ctx._vars[local_578].cur._data + 2);
      }
      else {
        regId = (uint)frame->_saRegId;
      }
    }
    else {
      regId = (uint)(byte)_archTraits[lVar20 + 1];
    }
  }
  uVar26 = (this->_emitter->_gpSignature)._bits;
  local_590 = (ulong)uVar26;
  local_598 = frame;
  local_588 = this;
  local_580 = uVar22;
  if (ctx._stackDstMask != '\0') {
    uVar7 = *(uint32_t *)
             ((long)(&frame->_dirtyRegs + -1) + ((ulong)(regId != frame->_spRegId) + 1) * 4);
    uVar25 = (uVar26 & 0xf8) + 2;
    local_570 = CONCAT44(regId,uVar7);
    pAVar1 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar20 + 0x14);
    local_5c0 = (WorkData *)
                CONCAT44(local_5c0._4_4_,(uint)((AVar3 & k32BitMask) == kUnknown) * 4 + 4);
    for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
      uVar18 = ctx._vars[uVar24].out._data;
      if ((uVar18 >> 9 & 1) != 0) {
        uVar17 = ctx._vars[uVar24].cur._data;
        if ((uVar17 & 0x300) == 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/emithelper.cpp"
                     ,0x90,"cur.isReg() || cur.isStack()");
        }
        dstReg.super_Operand.super_Operand_._signature._bits = 1;
        dstReg.super_Operand.super_Operand_._baseId = 0xff;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        local_5cc = (uint)local_5b8;
        if ((uVar26 & 0xf8) == 0) {
          local_5cc = ((int)uVar18 >> 0x1f) + (uint)local_5b8;
        }
        local_5c8 = (ulong)(uint)((int)uVar18 >> 0xc) << 0x20;
        local_5a0 = 0;
        if ((uVar26 & 0xf8) == 0) {
          uVar22 = (long)((int)uVar17 >> 0xc) + local_570;
          local_5a4 = (uint)(uVar22 >> 0x20);
        }
        else {
          uVar22 = (ulong)(((int)uVar17 >> 0xc) + uVar7);
          local_5a4 = regId;
        }
        local_59c = (undefined4)uVar22;
        local_5d0 = uVar25;
        _outGroup = uVar25;
        if ((uVar17 >> 10 & 1) == 0) {
          if ((uVar17 >> 8 & 1) == 0) goto LAB_00116d52;
          local_5f9 = (RegGroup)(uVar17 >> 0x18);
          pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
          local_5f9 = *(RegGroup *)((long)&pOVar14->_bits + 1) & kMaxValue;
          pWVar15 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_5f9);
          uVar18 = ctx._vars[uVar24].cur._data;
          uVar17 = uVar18 >> 0x10;
          local_5f9 = (RegGroup)(uVar18 >> 0x18);
          pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
          this = local_588;
          dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar17,pOVar14->_bits) & 0xffffffffff
          ;
          FuncArgsContext::WorkData::unassign(pWVar15,(uint32_t)uVar24,uVar17 & 0xff);
        }
        else {
          if ((uVar17 >> 9 & 1) != 0) {
            return 0x19;
          }
          local_5a4 = uVar17 >> 0x10 & 0xff;
LAB_00116d52:
          bVar21 = TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100];
          if ((byte)TypeUtils::_typeData[((ulong)uVar17 & 0xff) + 0x100] <
              (byte)TypeUtils::_typeData[((ulong)uVar18 & 0xff) + 0x100]) {
            bVar21 = TypeUtils::_typeData[((ulong)uVar18 & 0xff) + 0x100];
          }
          if ((uint)local_5c0 < bVar21) {
            if (((byte)((char)uVar18 - 0x20U) < 10) && ((byte)((char)uVar17 - 0x20U) < 10)) {
LAB_00116dce:
              local_5f9 = kX86_DReg;
            }
            else if (bVar21 < 9) {
              local_5f9 = kX86_Tmm|kVec;
              pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
              if (pOVar14->_bits != 0) {
                local_5f9 = kX86_Tmm|kVec;
                goto LAB_00116dd3;
              }
LAB_00116ed3:
              local_5f9 = kX86_St|kPC;
              pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
              if (pOVar14->_bits == 0) {
LAB_00116ef7:
                local_5f9 = kX86_St|kExtraNonVirt;
                pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                          operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
                if (pOVar14->_bits == 0) goto LAB_00116f1f;
                local_5f9 = kX86_St|kExtraNonVirt;
              }
              else {
                local_5f9 = kX86_St|kPC;
              }
            }
            else {
              if (bVar21 < 0x11) goto LAB_00116ed3;
              if (bVar21 < 0x21) goto LAB_00116ef7;
              if (0x40 < bVar21) {
                return 3;
              }
LAB_00116f1f:
              local_5f9 = kX86_St|kX86_CReg;
              pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
              if (pOVar14->_bits == 0) {
                return 3;
              }
              local_5f9 = kX86_St|kX86_CReg;
            }
          }
          else {
            if (4 < bVar21) goto LAB_00116dce;
            local_5f9 = kX86_CReg;
          }
LAB_00116dd3:
          pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                    operator[]<asmjit::v1_14::RegType>(pAVar1,&local_5f9);
          SVar8._bits = pOVar14->_bits;
          if (SVar8._bits == 0) {
            return 3;
          }
          local_5f9 = (RegGroup)(SVar8._bits >> 8) & kMaxValue;
          pWVar15 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_5f9);
          uVar18 = ~pWVar15->_assignedRegs & pWVar15->_workRegs;
          if (uVar18 == 0) {
            return 3;
          }
          dstReg.super_Operand.super_Operand_._baseId = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                dstReg.super_Operand.super_Operand_._baseId =
                     dstReg.super_Operand.super_Operand_._baseId + 1) {
            }
          }
          dstReg.super_Operand.super_Operand_._signature._bits = SVar8._bits;
          EVar13 = (*this->_vptr_BaseEmitHelper[4])
                             (this,&dstReg,(ulong)(byte)ctx._vars[uVar24].out._data,&outGroup,
                              (ulong)(byte)ctx._vars[uVar24].cur._data,0);
          if (EVar13 != 0) {
            return EVar13;
          }
        }
        uVar18 = ctx._vars[uVar24].cur._data;
        if ((~uVar18 & 0x500) == 0) {
          local_5f9 = k0;
          pWVar15 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&local_5f9);
          FuncArgsContext::WorkData::unassign
                    (pWVar15,(uint32_t)uVar24,
                     (uint)*(byte *)((long)&ctx._vars[uVar24].cur._data + 2));
          uVar18 = ctx._vars[uVar24].cur._data;
        }
        EVar13 = (*this->_vptr_BaseEmitHelper[2])(this,&local_5d0,&dstReg,(ulong)(uVar18 & 0xff),0);
        if (EVar13 != 0) {
          return EVar13;
        }
        pbVar2 = (byte *)((long)&ctx._vars[uVar24].cur._data + 1);
        *pbVar2 = *pbVar2 | 8;
        uVar22 = local_580;
      }
    }
  }
  local_5b8 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)((long)local_5b0 + 0x14);
  local_5b0 = (Array<asmjit::v1_14::InstHints,_4UL> *)((long)local_5b0 + 0x10);
  uVar24 = 0;
  uVar26 = 0;
  bVar10 = false;
  do {
    while (pAVar1 = local_5b8, uVar24 == uVar22) {
      if (!bVar10) {
        if (ctx._hasStackSrc != true) {
          return 0;
        }
        if ((local_598->_minDynamicAlignment <= local_598->_finalStackAlignment) &&
           ((local_598->_attributes & kHasPreservedFP) == kNoAttributes)) {
          if ((uint)local_578 < (uint)uVar22) {
            bVar21 = *(byte *)((long)&ctx._vars[local_578 & 0xffffffff].cur._data + 2);
          }
          else {
            bVar21 = local_598->_saRegId;
          }
          regId = (uint)bVar21;
        }
        local_5b0 = (Array<asmjit::v1_14::InstHints,_4UL> *)
                    (ulong)*(uint32_t *)
                            ((long)(&local_598->_dirtyRegs + -1) +
                            ((ulong)(regId != local_598->_spRegId) + 1) * 4);
        uVar26 = (uint)local_590 & 0xf8;
        local_590 = (ulong)uVar26;
        local_5c0 = (WorkData *)CONCAT44(local_5c0._4_4_,uVar26 + 2);
        local_570 = (ulong)regId;
        local_598 = (FuncFrame *)
                    CONCAT44(regId,*(uint32_t *)
                                    ((long)(&local_598->_dirtyRegs + -1) +
                                    ((ulong)(regId != local_598->_spRegId) + 1) * 4));
        uVar26 = 1;
        uVar18 = 0;
        do {
          if (uVar26 <= uVar18) {
            return 0;
          }
          local_578 = CONCAT44(local_578._4_4_,uVar18);
          for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
            if ((ctx._vars[uVar24].cur._data & 0xa00) == 0x200) {
              uVar18 = ctx._vars[uVar24].out._data;
              if ((uVar18 >> 8 & 1) == 0) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/emithelper.cpp"
                           ,0x136,"var.out.isReg()");
              }
              uVar17 = uVar18 >> 0x10 & 0xff;
              uVar23 = (undefined1)(uVar18 >> 0x18);
              dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = uVar23;
              pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(local_5b8,(RegType *)&dstReg);
              _outGroup = CONCAT31(uStack_5a7,*(undefined1 *)((long)&pOVar14->_bits + 1)) &
                          0xffffff0f;
              pWVar15 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                        operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&outGroup);
              if ((uVar17 == regId) && (outGroup == k0)) {
                if (uVar26 == 1) {
                  uVar26 = 2;
                  uVar22 = local_580;
                  goto LAB_001174e7;
                }
                FuncArgsContext::WorkData::unassign
                          (pWVar15,(uint)pWVar15->_physToVarId[local_570],regId);
              }
              local_5d0 = CONCAT31(local_5d0._1_3_,uVar23);
              pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>(local_5b8,(RegType *)&local_5d0);
              dstReg.super_Operand.super_Operand_._0_8_ =
                   CONCAT44(uVar18 >> 0x10,pOVar14->_bits) & 0xffffffffff;
              dstReg.super_Operand.super_Operand_._data[0] = 0;
              dstReg.super_Operand.super_Operand_._data[1] = 0;
              uVar9 = ctx._vars[uVar24].cur._data;
              iVar19 = (int)uVar9 >> 0xc;
              local_5d0 = (uint)local_5c0;
              if ((int)local_590 == 0) {
                uVar22 = (long)iVar19 + (long)local_598;
                local_5cc = (uint)(uVar22 >> 0x20);
              }
              else {
                uVar22 = (ulong)(uint)(iVar19 + (int)local_5b0);
                local_5cc = regId;
              }
              local_5c8 = uVar22 << 0x20;
              EVar13 = (*local_588->_vptr_BaseEmitHelper[4])
                                 (local_588,&dstReg,(ulong)(byte)ctx._vars[uVar24].out._data,
                                  &local_5d0,(ulong)(uVar9 & 0xff),0);
              if (EVar13 != 0) {
                return EVar13;
              }
              FuncArgsContext::WorkData::assign(pWVar15,(uint32_t)uVar24,uVar17);
              ctx._vars[uVar24].cur._data =
                   (uint)(byte)ctx._vars[uVar24].cur._data + (uVar17 << 0x10 | uVar18 & 0xff000000)
                   + 0x900;
              uVar22 = local_580;
            }
LAB_001174e7:
          }
          uVar18 = (int)local_578 + 1;
        } while( true );
      }
      if ((uVar26 & 5) == 4) {
        return 3;
      }
      uVar26 = (~uVar26 & 1) << 2;
      bVar10 = false;
      uVar24 = 0;
    }
    uVar18 = ctx._vars[uVar24].cur._data;
    if ((uVar18 & 0x900) == 0x100) {
      dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)(uVar18 >> 0x18);
      pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                operator[]<asmjit::v1_14::RegType>(local_5b8,(RegType *)&dstReg);
      bVar21 = *(byte *)((long)&pOVar14->_bits + 1);
      dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
           *(undefined1 *)((long)&ctx._vars[uVar24].out._data + 3);
      pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                operator[]<asmjit::v1_14::RegType>(pAVar1,(RegType *)&dstReg);
      bVar4 = *(byte *)((long)&pOVar14->_bits + 1);
      _outGroup = CONCAT31(uStack_5a7,bVar4) & 0xffffff0f;
      if ((bVar21 & 0xf) != (bVar4 & 0xf)) {
        return 0x19;
      }
      bVar4 = *(byte *)((long)&ctx._vars[uVar24].cur._data + 2);
      bVar5 = *(byte *)((long)&ctx._vars[uVar24].out._data + 2);
      uVar25 = (uint32_t)bVar5;
      local_5c0 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                  operator[]<asmjit::v1_14::RegGroup>(&ctx._workData,&outGroup);
      bVar12 = FuncArgsContext::WorkData::isAssigned(local_5c0,(uint)bVar5);
      if (((uint)bVar4 == (uint)bVar5) || (!bVar12)) {
LAB_001170ba:
        pAVar1 = local_5b8;
        uVar18 = (uint)bVar4;
        dstReg.super_Operand.super_Operand_._signature._bits._0_1_ =
             *(undefined1 *)((long)&ctx._vars[uVar24].out._data + 3);
        pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(local_5b8,(RegType *)&dstReg);
        dstReg.super_Operand.super_Operand_._baseId = uVar25;
        dstReg.super_Operand.super_Operand_._signature._bits = pOVar14->_bits;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        uVar7 = ctx._vars[uVar24].out._data;
        local_5d0 = CONCAT31(local_5d0._1_3_,*(undefined1 *)((long)&ctx._vars[uVar24].cur._data + 3)
                            );
        pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                  operator[]<asmjit::v1_14::RegType>(pAVar1,(RegType *)&local_5d0);
        local_5d0 = pOVar14->_bits;
        local_5c8 = 0;
        local_5cc = uVar18;
        EVar13 = (*local_588->_vptr_BaseEmitHelper[4])
                           (local_588,&dstReg,(ulong)(byte)uVar7,&local_5d0,
                            (ulong)(byte)ctx._vars[uVar24].cur._data,0);
        if (EVar13 != 0) {
          return EVar13;
        }
        if (uVar18 != uVar25) {
          FuncArgsContext::WorkData::reassign(local_5c0,(uint32_t)uVar24,uVar25,uVar18);
        }
        uVar18 = ctx._vars[uVar24].out._data;
        ctx._vars[uVar24].cur._data =
             (uint)(uVar25 == (uVar18 >> 0x10 & 0xff)) * 0x800 +
             (uVar18 & 0xff0000ff | uVar25 << 0x10) + 0x100;
        uVar17 = 3;
        bVar11 = 1;
      }
      else {
        bVar6 = local_5c0->_physToVarId[bVar5];
        uVar18 = ctx._vars[bVar6].out._data;
        if (uVar18 == 0) {
LAB_00117066:
          dstReg.super_Operand.super_Operand_._0_8_ =
               CONCAT71(dstReg.super_Operand.super_Operand_._1_7_,bVar21) & 0xffffffffffffff0f;
          pIVar16 = Support::Array<asmjit::v1_14::InstHints,_4UL>::
                    operator[]<asmjit::v1_14::RegGroup>(local_5b0,(RegGroup *)&dstReg);
          if ((*pIVar16 & kRegSwap) == kNoHints) {
            uVar17 = 0;
            uVar18 = ~local_5c0->_assignedRegs & local_5c0->_workRegs;
            bVar11 = 1;
            if (uVar18 != 0) {
              uVar17 = ~local_5c0->_dstRegs & uVar18;
              if (uVar17 == 0) {
                uVar17 = uVar18;
              }
              uVar25 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              goto LAB_001170ba;
            }
          }
          else {
            bVar21 = *(byte *)((long)&ctx._vars[bVar6].cur._data + 3);
            uVar17 = (uint)*(byte *)((long)&ctx._vars[uVar24].cur._data + 3);
            uVar18 = (uint)bVar21;
            if (bVar21 < uVar17) {
              uVar18 = uVar17;
            }
            if (uVar18 - 3 < 3) {
              uVar18 = 6;
            }
            dstReg.super_Operand.super_Operand_._signature._bits._0_1_ = (char)uVar18;
            pOVar14 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>(local_5b8,(RegType *)&dstReg);
            local_5d0 = pOVar14->_bits;
            dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar5;
            dstReg.super_Operand.super_Operand_._signature._bits = local_5d0;
            dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
            dstReg.super_Operand.super_Operand_._data[0] = 0;
            dstReg.super_Operand.super_Operand_._data[1] = 0;
            local_5c8 = 0;
            local_5cc = (uint)bVar4;
            EVar13 = (*local_588->_vptr_BaseEmitHelper[3])(local_588,&dstReg,&local_5d0,0);
            if (EVar13 != 0) {
              return EVar13;
            }
            FuncArgsContext::WorkData::swap
                      (local_5c0,(uint32_t)uVar24,(uint)bVar4,(uint)bVar6,(uint)bVar5);
            ctx._vars[uVar24].cur._data =
                 (ctx._vars[uVar24].cur._data & 0xff00f7ff) + (uint)bVar5 * 0x10000 + 0x800;
            uVar18 = ctx._vars[bVar6].cur._data & 0xff00ffff | (uint)bVar4 << 0x10;
            ctx._vars[bVar6].cur._data = uVar18;
            uVar17 = 1;
            bVar11 = 0;
            if (ctx._vars[bVar6].out._data != 0) {
              ctx._vars[bVar6].cur._data = uVar18 | 0x800;
              bVar11 = 0;
            }
          }
        }
        else {
          uVar17 = 0;
          bVar11 = 1;
          if (((uVar18 >> 8 & 1) != 0) && (bVar11 = 1, (uVar18 >> 0x10 & 0xff) == (uint)bVar4))
          goto LAB_00117066;
        }
      }
      uVar26 = uVar26 | uVar17;
      bVar10 = (bool)(bVar10 | bVar11);
      uVar22 = local_580;
    }
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  Arch arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  auto& workData = ctx._workData;
  uint32_t varCount = ctx._varCount;
  uint32_t saVarId = ctx._saVarId;

  BaseReg sp = BaseReg(_emitter->_gpSignature, archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t regId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), regId);
        wd.unassign(varId, regId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which register to use. In general
        // we follow the rule that IntToInt moves will use GP regs with possibility to signature or zero extend,
        // and all other moves will either use GP or VEC regs depending on the size of the move.
        OperandSignature signature = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!signature.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[signature.regGroup()];
        RegMask availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t availableId = Support::ctz(availableRegs);
        reg.setSignatureAndId(signature, availableId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[RegGroup::kGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // Shuffle all registers that are currently assigned accordingly to target assignment.

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      RegGroup curGroup = archTraits.regTypeToGroup(cur.regType());
      RegGroup outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId) || curId == outId) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          // Only reassign if this is not a sign/zero extension that happens on the same in/out register.
          if (curId != outId)
            wd.reassign(varId, outId, curId);

          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasInstRegSwap(curGroup)) {
              RegType highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween(highestType, RegType::kGp8Lo, RegType::kGp16))
                highestType = RegType::kGp32;

              OperandSignature signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg(signature, outId), BaseReg(signature, curId)));

              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              RegMask availableRegs = wd.availableRegs();
              if (availableRegs) {
                RegMask inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          RegType outType = var.out.regType();

          RegGroup group = archTraits.regTypeToGroup(outType);
          WorkData& wd = workData[group];

          if (outId == sa.id() && group == RegGroup::kGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}